

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

void pybind11::detail::clear_instance(PyObject *self)

{
  ulong uVar1;
  pointer pptVar2;
  pointer pptVar3;
  void *valueptr;
  pointer pptVar4;
  long *plVar5;
  type_info *tinfo;
  byte bVar6;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar7;
  internals *piVar8;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> __it;
  undefined8 *puVar9;
  bool bVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar11;
  iterator __begin2;
  value_and_holder local_58;
  void *local_38;
  
  pvVar7 = all_type_info(self->ob_type);
  pptVar2 = (pvVar7->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pptVar3 = (pvVar7->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pptVar2 == pptVar3) {
    local_58.type = (type_info *)0x0;
  }
  else {
    local_58.type = *pptVar2;
  }
  local_58.index = 0;
  local_58.vh = (void **)(self + 1);
  if ((self[3].ob_refcnt & 2) == 0) {
    local_58.vh = (void **)((PyObject *)local_58.vh)->ob_refcnt;
  }
  local_58.inst = (instance *)self;
  do {
    tinfo = local_58.type;
    if (local_58.index == (long)pptVar3 - (long)pptVar2 >> 3) {
      instance::deallocate_layout((instance *)self);
      if (self[2].ob_type != (PyTypeObject *)0x0) {
        PyObject_ClearWeakRefs(self);
      }
      puVar9 = (undefined8 *)_PyObject_GetDictPtr(self);
      if ((puVar9 != (undefined8 *)0x0) && (plVar5 = (long *)*puVar9, plVar5 != (long *)0x0)) {
        *puVar9 = 0;
        *plVar5 = *plVar5 + -1;
        if (*plVar5 == 0) {
          _Py_Dealloc();
        }
      }
      if ((self[3].ob_refcnt & 0x10) != 0) {
        clear_patients(self);
      }
      return;
    }
    valueptr = (void *)*(Py_ssize_t *)local_58.vh;
    if (valueptr != (void *)0x0) {
      if (((local_58.inst)->field_0x30 & 2) == 0) {
        bVar6 = *(byte *)((long)((local_58.inst)->field_1).simple_value_holder[1] + local_58.index)
                & 2;
      }
      else {
        bVar6 = (byte)(local_58.inst)->field_0x30 >> 3 & 1;
      }
      if (bVar6 != 0) {
        local_38 = valueptr;
        piVar8 = get_internals();
        pVar11 = std::
                 _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 ::equal_range(&(piVar8->registered_instances)._M_h,&local_38);
        __it._M_cur = (__node_type *)
                      pVar11.first.
                      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                      ._M_cur;
        bVar10 = (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                  )__it._M_cur !=
                 pVar11.second.
                 super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                 ._M_cur.
                 super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
        ;
        if (bVar10) {
          do {
            if (self->ob_type == *(PyTypeObject **)(*(long *)((long)__it._M_cur + 0x10) + 8)) {
              std::
              _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
              ::erase(&(piVar8->registered_instances)._M_h,(const_iterator)__it._M_cur);
              bVar10 = true;
              break;
            }
            __it._M_cur = *__it._M_cur;
            bVar10 = (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                      )__it._M_cur !=
                     pVar11.second.
                     super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
            ;
          } while (bVar10);
        }
        if ((tinfo->field_0x90 & 2) == 0) {
          traverse_offset_bases(valueptr,tinfo,(instance *)self,deregister_instance_impl);
        }
        if (!bVar10) {
          pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");
        }
      }
      if ((self[3].ob_refcnt & 1) == 0) {
        if (((local_58.inst)->field_0x30 & 2) == 0) {
          bVar6 = *(byte *)((long)((local_58.inst)->field_1).simple_value_holder[1] + local_58.index
                           );
        }
        else {
          bVar6 = (byte)(local_58.inst)->field_0x30 >> 2;
        }
        if ((bVar6 & 1) == 0) goto LAB_001c1775;
      }
      (*(local_58.type)->dealloc)(&local_58);
    }
LAB_001c1775:
    if ((self[3].ob_refcnt & 2) == 0) {
      local_58.vh = (PyTypeObject **)((long)local_58.vh + 8) +
                    (pvVar7->
                    super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[local_58.index]->holder_size_in_ptrs;
    }
    uVar1 = local_58.index + 1;
    pptVar4 = (pvVar7->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (uVar1 < (ulong)((long)(pvVar7->
                              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pptVar4 >> 3)) {
      local_58.type = pptVar4[local_58.index + 1];
      local_58.index = uVar1;
    }
    else {
      local_58.type = (type_info *)0x0;
      local_58.index = uVar1;
    }
  } while( true );
}

Assistant:

inline void clear_instance(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Deallocate any values/holders, if present:
    for (auto &v_h : values_and_holders(instance)) {
        if (v_h) {

            // We have to deregister before we call dealloc because, for virtual MI types, we still
            // need to be able to get the parent pointers.
            if (v_h.instance_registered() && !deregister_instance(instance, v_h.value_ptr(), v_h.type))
                pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");

            if (instance->owned || v_h.holder_constructed())
                v_h.type->dealloc(v_h);
        }
    }
    // Deallocate the value/holder layout internals:
    instance->deallocate_layout();

    if (instance->weakrefs)
        PyObject_ClearWeakRefs(self);

    PyObject **dict_ptr = _PyObject_GetDictPtr(self);
    if (dict_ptr)
        Py_CLEAR(*dict_ptr);

    if (instance->has_patients)
        clear_patients(self);
}